

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O2

void __thiscall QAbstractProxyModel::QAbstractProxyModel(QAbstractProxyModel *this,QObject *parent)

{
  QAbstractProxyModelPrivate *this_00;
  QAbstractItemModel *pQVar1;
  
  this_00 = (QAbstractProxyModelPrivate *)operator_new(0xe8);
  QAbstractProxyModelPrivate::QAbstractProxyModelPrivate(this_00);
  QAbstractItemModel::QAbstractItemModel
            ((QAbstractItemModel *)this,(QAbstractItemModelPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_0066c250;
  pQVar1 = QAbstractItemModelPrivate::staticEmptyModel();
  (**(code **)(*(long *)this + 0x188))(this,pQVar1);
  return;
}

Assistant:

QAbstractProxyModel::QAbstractProxyModel(QObject *parent)
    :QAbstractItemModel(*new QAbstractProxyModelPrivate, parent)
{
    setSourceModel(QAbstractItemModelPrivate::staticEmptyModel());
}